

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

int AF_AActor_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *target;
  AActor *missile;
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar4;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  char *pcVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      target = (AActor *)(param->field_0).field_1.a;
      if (target != (AActor *)0x0) {
        if ((target->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
          (target->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
          uVar5 = extraout_RDX;
        }
        pPVar4 = (target->super_DThinker).super_DObject.Class;
        bVar7 = pPVar4 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar7);
        uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar7);
        defaultparam = (TArray<VMValue,_VMValue> *)
                       CONCAT71((int7)((ulong)defaultparam >> 8),pPVar4 == pPVar1 || bVar7);
        if (pPVar4 != pPVar1 && !bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar4 != (PClass *)0x0);
            if (pPVar4 == pPVar1) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00416f8a;
        }
      }
      pPVar1 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((iVar2 = param[1].field_0.i, param[2].field_0.field_1.atag == 1 ||
                (param[2].field_0.field_1.a == (void *)0x0)))) {
              missile = (AActor *)param[2].field_0.field_1.a;
              if (missile == (AActor *)0x0) {
                P_TraceBleed(iVar2,target);
              }
              else {
                if ((missile->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                  iVar3 = (**(missile->super_DThinker).super_DObject._vptr_DObject)
                                    (missile,defaultparam,uVar5,ret);
                  (missile->super_DThinker).super_DObject.Class =
                       (PClass *)CONCAT44(extraout_var_00,iVar3);
                }
                pPVar4 = (missile->super_DThinker).super_DObject.Class;
                bVar7 = pPVar4 != (PClass *)0x0;
                if (pPVar4 != pPVar1 && bVar7) {
                  do {
                    pPVar4 = pPVar4->ParentClass;
                    bVar7 = pPVar4 != (PClass *)0x0;
                    if (pPVar4 == pPVar1) break;
                  } while (pPVar4 != (PClass *)0x0);
                }
                if (!bVar7) {
                  pcVar6 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
                  goto LAB_00416fa9;
                }
                P_TraceBleed(iVar2,target,missile);
              }
              return 0;
            }
            pcVar6 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_00416fa9:
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x12cd,
                        "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x12cc,
                    "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00416f8a:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12cb,
                "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_OBJECT(missile, AActor);

	if (missile) P_TraceBleed(damage, self, missile);
	else P_TraceBleed(damage, self);
	return 0;
}